

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O1

void __thiscall L15_4::LabeledSales::LabeledSales(LabeledSales *this,string *lb,int y)

{
  (this->super_Sales)._year = y;
  (this->super_Sales)._gross[0] = 0.0;
  (this->super_Sales)._gross[1] = 0.0;
  (this->super_Sales)._gross[2] = 0.0;
  (this->super_Sales)._gross[3] = 0.0;
  (this->super_Sales)._gross[4] = 0.0;
  (this->super_Sales)._gross[5] = 0.0;
  (this->super_Sales)._gross[6] = 0.0;
  (this->super_Sales)._gross[7] = 0.0;
  (this->super_Sales)._gross[8] = 0.0;
  (this->super_Sales)._gross[9] = 0.0;
  (this->super_Sales)._gross[10] = 0.0;
  (this->super_Sales)._gross[0xb] = 0.0;
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_00134ab0;
  (this->_label)._M_dataplus._M_p = (pointer)&(this->_label).field_2;
  (this->_label)._M_string_length = 0;
  (this->_label).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_label);
  return;
}

Assistant:

Sales::Sales(int y) {
        _year = y;
        for (int i = 0; i < MONTHS; ++i) {
            _gross[i] = 0;
        }
    }